

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall
QCss::ValueExtractor::extractPalette
          (ValueExtractor *this,QBrush *foreground,QBrush *selectedForeground,
          QBrush *selectedBackground,QBrush *alternateBackground,QBrush *placeHolderTextForeground,
          QBrush *accent)

{
  Property PVar1;
  Declaration *pDVar2;
  bool bVar3;
  _Head_base<0UL,_QBrushData_*,_false> _Var4;
  QBrush *pQVar5;
  QPalette *pal;
  int i;
  ulong uVar6;
  long lVar7;
  long in_FS_OFFSET;
  _Head_base<0UL,_QBrushData_*,_false> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = 0;
  uVar6 = 0;
  bVar3 = false;
  do {
    if ((ulong)(this->declarations).d.size <= uVar6) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar3;
      }
      __stack_chk_fail();
    }
    pDVar2 = (this->declarations).d.ptr;
    pal = (QPalette *)((long)&(pDVar2->d).d.ptr + lVar7);
    PVar1 = (pDVar2[uVar6].d.d.ptr)->propertyId;
    if (PVar1 == QtAccent) {
      Declaration::brushValue((Declaration *)&local_40,pal);
      pQVar5 = accent;
LAB_00542229:
      _Var4._M_head_impl =
           (pQVar5->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
           super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
           super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
      (pQVar5->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
LAB_00542234:
      local_40._M_head_impl = _Var4._M_head_impl;
      QBrush::~QBrush((QBrush *)&local_40);
      bVar3 = true;
    }
    else {
      if (PVar1 == QtSelectionForeground) {
        Declaration::brushValue((Declaration *)&local_40,pal);
        pQVar5 = selectedForeground;
        goto LAB_00542229;
      }
      if (PVar1 == QtSelectionBackground) {
        Declaration::brushValue((Declaration *)&local_40,pal);
        pQVar5 = selectedBackground;
        goto LAB_00542229;
      }
      if (PVar1 == QtAlternateBackground) {
        Declaration::brushValue((Declaration *)&local_40,pal);
        pQVar5 = alternateBackground;
        goto LAB_00542229;
      }
      if (PVar1 == QtPlaceHolderTextColor) {
        Declaration::brushValue((Declaration *)&local_40,pal);
        pQVar5 = placeHolderTextForeground;
        goto LAB_00542229;
      }
      if (PVar1 == Color) {
        Declaration::brushValue((Declaration *)&local_40,pal);
        _Var4._M_head_impl =
             (foreground->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
             super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
             super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
        (foreground->d)._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
        super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = local_40._M_head_impl;
        goto LAB_00542234;
      }
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 8;
  } while( true );
}

Assistant:

bool ValueExtractor::extractPalette(QBrush *foreground,
                                    QBrush *selectedForeground,
                                    QBrush *selectedBackground,
                                    QBrush *alternateBackground,
                                    QBrush *placeHolderTextForeground,
                                    QBrush *accent)
{
    bool hit = false;
    for (int i = 0; i < declarations.size(); ++i) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case Color: *foreground = decl.brushValue(pal); break;
        case QtSelectionForeground: *selectedForeground = decl.brushValue(pal); break;
        case QtSelectionBackground: *selectedBackground = decl.brushValue(pal); break;
        case QtAlternateBackground: *alternateBackground = decl.brushValue(pal); break;
        case QtPlaceHolderTextColor: *placeHolderTextForeground = decl.brushValue(pal); break;
        case QtAccent: *accent = decl.brushValue(pal); break;
        default: continue;
        }
        hit = true;
    }
    return hit;
}